

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calculator.hpp
# Opt level: O2

void __thiscall calculator::error::~error(error *this)

{
  ~error(this);
  operator_delete(this,0x30);
  return;
}

Assistant:

error(const std::string& expr, const std::string& message)
    : std::runtime_error(message),
      expr_(expr)
  { }